

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

void __thiscall QAccessibleWidget::doAction(QAccessibleWidget *this)

{
  QString *in_RSI;
  
  doAction((QAccessibleWidget *)&this[-1].super_QAccessibleActionInterface,in_RSI);
  return;
}

Assistant:

void QAccessibleWidget::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == setFocusAction()) {
        if (widget()->isWindow())
            widget()->activateWindow();
        widget()->setFocus();
    }
}